

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_getCookie
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  byte bVar1;
  int iVar2;
  ushort *puVar3;
  void *pvVar4;
  byte *str;
  undefined8 *puVar5;
  size_t __n;
  undefined4 in_register_00000034;
  uint __c;
  size_t len;
  byte *__s1;
  byte *pbVar6;
  bool bVar7;
  long local_58;
  
  if (oargc == (uint *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = (long)(int)*oargc;
  }
  if ((getp_getCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_getCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                  CONCAT44(in_register_00000034,self)), iVar2 != 0)) {
    getp_getCookie::desc.min_argc_ = 1;
    getp_getCookie::desc.opt_argc_ = 0;
    getp_getCookie::desc.varargs_ = 0;
    __cxa_guard_release(&getp_getCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getCookie::desc);
  if (iVar2 == 0) {
    puVar5 = *(undefined8 **)(*(long *)(this->super_CVmObject).ext_ + 0x58);
    puVar3 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar3 == (ushort *)0x0) {
      err_throw(0x900);
    }
    retval->typ = VM_NIL;
    while (puVar5 = (undefined8 *)puVar5[2], puVar5 != (undefined8 *)0x0) {
      iVar2 = stricmp((char *)*puVar5,"cookie");
      if (iVar2 == 0) {
        pbVar6 = (byte *)puVar5[1];
        bVar7 = *pbVar6 == 0;
        while (!bVar7) {
          __s1 = pbVar6 + -1;
          str = pbVar6;
          do {
            str = str + 1;
            bVar1 = __s1[1];
            __s1 = __s1 + 1;
            iVar2 = isspace((int)(char)bVar1);
          } while (iVar2 != 0);
          __n = 0;
LAB_00204bb1:
          __c = (uint)bVar1;
          if (bVar1 == 0) {
            __c = 0;
          }
          else {
            pvVar4 = memchr("=;,",(int)(char)bVar1,4);
            if (pvVar4 == (void *)0x0) goto code_r0x00204bca;
            if (bVar1 == 0x3d) {
              len = 0;
              pbVar6 = str;
              while ((__c = (uint)(char)*pbVar6, __c != 0 &&
                     (pvVar4 = memchr(" \t;,",__c,5), pvVar4 == (void *)0x0))) {
                pbVar6 = pbVar6 + 1;
                len = len + 1;
              }
              goto LAB_00204c22;
            }
          }
          pbVar6 = str + -1;
          str = (byte *)0x2b4e29;
          len = 0;
LAB_00204c22:
          if ((__n == *puVar3) && (iVar2 = bcmp(__s1,puVar3 + 1,__n), iVar2 == 0)) {
            new_parsed_str(retval,(char *)str,len,0);
            goto LAB_00204c9a;
          }
          while( true ) {
            bVar7 = (char)__c == '\0';
            if ((bVar7) || (pvVar4 = memchr(" \t;,",(int)(char)__c,5), pvVar4 == (void *)0x0))
            break;
            __c = (uint)pbVar6[1];
            pbVar6 = pbVar6 + 1;
          }
        }
      }
    }
LAB_00204c9a:
    sp_ = sp_ + -local_58;
  }
  return 1;
code_r0x00204bca:
  bVar1 = *str;
  str = str + 1;
  __n = __n + 1;
  goto LAB_00204bb1;
}

Assistant:

int CVmObjHTTPRequest::getp_getCookie(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* get the cookie name argument */
    const char *cname = G_stk->get(0)->get_as_string(vmg0_);
    if (cname == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* presume we won't find a match */
    retval->set_nil();

    /* scan for "Cookie" headers */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
    {
        /* if this is a Cookie: header, process it */
        if (stricmp(hdrs->name, "cookie") == 0)
        {
            /* scan the list of cookie name=value pairs */
            for (const char *p = hdrs->value ; *p != '\0' ; )
            {
                /* skip leading whitespace */
                for ( ; isspace(*p) ; ++p) ;

                /* the cookie name ends at the '=', ';', ',', or null */
                const char *name = p;
                for ( ; *p != '\0' && strchr("=;,", *p) == 0 ; ++p) ;
                size_t namelen = p - name;

                /* if we found the '=', scan the value */
                const char *val = "";
                size_t vallen = 0;
                if (*p == '=')
                {
                    /* skip the '=' and scan for the end of the cookie */
                    for (val = ++p ; *p != '\0' && strchr(" \t;,", *p) == 0 ;
                         ++p) ;
                    vallen = p - val;
                }

                /* if this matches the name we're looking for, return it */
                if (namelen == vmb_get_len(cname)
                    && memcmp(name, cname + VMB_LEN, namelen) == 0)
                {
                    /* it's a match - return the value as a string */
                    new_parsed_str(vmg_ retval, val, vallen, ENCMODE_NONE);

                    /* stop looking */
                    goto done;
                }
                
                /* scan ahead to the next non-delimiter */
                for ( ; *p != '\0' && strchr(" \t;,", *p) != 0 ; ++p) ;
            }
        }
    }

done:
    /* done with the arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}